

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O0

bool __thiscall
CCheckQueue<MemoryCheck>::Loop(CCheckQueue<FakeCheckCheckCompletion> *this,bool fMaster)

{
  const_iterator __last;
  byte bVar1;
  bool bVar2;
  uint *puVar3;
  byte in_SIL;
  long in_RDI;
  long in_FS_OFFSET;
  MemoryCheck *check;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *__range3;
  bool fRet;
  bool fOk;
  uint nNow;
  condition_variable *cond;
  iterator __end0;
  iterator __begin0;
  __normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_> start_it
  ;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  UniqueLock<AnnotatedMixin<std::mutex>_> lock;
  Mutex *in_stack_fffffffffffffeb8;
  __normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
  in_stack_fffffffffffffec0;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>_>
  in_stack_fffffffffffffed0;
  move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>_>
  in_stack_fffffffffffffed8;
  move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>_>
  in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  AnnotatedMixin<std::mutex> *in_stack_fffffffffffffef0;
  move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>_>
  in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  byte bVar4;
  const_iterator __first;
  unique_lock *local_f0;
  bool local_a9;
  uint local_a8;
  byte local_79;
  MemoryCheck local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  if (bVar1 == 0) {
    local_f0 = (unique_lock *)(in_RDI + 0x28);
  }
  else {
    local_f0 = (unique_lock *)(in_RDI + 0x58);
  }
  __first._M_current = local_30;
  std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_fffffffffffffeb8);
  std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::reserve
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_fffffffffffffef8._M_current._M_current,(size_type)in_stack_fffffffffffffef0);
  local_a8 = 0;
  local_a9 = true;
  do {
    MaybeCheckNotHeld(in_stack_fffffffffffffeb8);
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               in_stack_fffffffffffffef8._M_current._M_current,in_stack_fffffffffffffef0,
               in_stack_fffffffffffffee8,(char *)in_stack_fffffffffffffee0._M_current._M_current,
               (int)((ulong)in_stack_fffffffffffffed8._M_current._M_current >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffed8._M_current._M_current >> 0x18,0));
    if (local_a8 == 0) {
      *(int *)(in_RDI + 0xa4) = *(int *)(in_RDI + 0xa4) + 1;
    }
    else {
      *(bool *)(in_RDI + 0xa8) = (*(byte *)(in_RDI + 0xa8) & 1 & local_a9) != 0;
      *(uint *)(in_RDI + 0xac) = *(int *)(in_RDI + 0xac) - local_a8;
      if ((*(int *)(in_RDI + 0xac) == 0) && (bVar1 == 0)) {
        std::condition_variable::notify_one();
      }
    }
    while( true ) {
      bVar2 = std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::empty
                        ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                          *)CONCAT17(in_stack_fffffffffffffecf,
                                     CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)))
      ;
      bVar4 = 0;
      if (bVar2) {
        bVar4 = *(byte *)(in_RDI + 0xd0) ^ 0xff;
      }
      if ((bVar4 & 1) == 0) {
        if ((*(byte *)(in_RDI + 0xd0) & 1) == 0) {
          in_stack_fffffffffffffee8 = (char *)(in_RDI + 0xb0);
          in_stack_fffffffffffffef0 = (AnnotatedMixin<std::mutex> *)(in_RDI + 0x88);
          std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::size
                    ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     in_stack_fffffffffffffeb8);
          std::min<unsigned_int>
                    ((uint *)in_stack_fffffffffffffec0._M_current,(uint *)in_stack_fffffffffffffeb8)
          ;
          puVar3 = std::max<unsigned_int>
                             ((uint *)in_stack_fffffffffffffec0._M_current,
                              (uint *)in_stack_fffffffffffffeb8);
          local_a8 = *puVar3;
          std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::end
                    ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     in_stack_fffffffffffffec0._M_current);
          __gnu_cxx::
          __normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
          ::operator-((__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                       *)CONCAT17(in_stack_fffffffffffffecf,
                                  CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)),
                      (difference_type)in_stack_fffffffffffffec0._M_current);
          in_stack_fffffffffffffef8 =
               std::
               make_move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck*,std::vector<MemoryCheck,std::allocator<MemoryCheck>>>>
                         (in_stack_fffffffffffffec0);
          std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::end
                    ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     in_stack_fffffffffffffec0._M_current);
          in_stack_fffffffffffffee0 =
               std::
               make_move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck*,std::vector<MemoryCheck,std::allocator<MemoryCheck>>>>
                         (in_stack_fffffffffffffec0);
          std::vector<MemoryCheck,std::allocator<MemoryCheck>>::
          assign<std::move_iterator<__gnu_cxx::__normal_iterator<MemoryCheck*,std::vector<MemoryCheck,std::allocator<MemoryCheck>>>>,void>
                    ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     in_stack_fffffffffffffeb8,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          in_stack_fffffffffffffed0._M_current._M_current =
               (__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                )(in_RDI + 0x88);
          __gnu_cxx::
          __normal_iterator<MemoryCheck_const*,std::vector<MemoryCheck,std::allocator<MemoryCheck>>>
          ::__normal_iterator<MemoryCheck*>
                    ((__normal_iterator<const_MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                      *)CONCAT17(in_stack_fffffffffffffecf,
                                 CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)),
                     (__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                      *)in_stack_fffffffffffffec0._M_current);
          std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::end
                    ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     in_stack_fffffffffffffec0._M_current);
          __gnu_cxx::
          __normal_iterator<MemoryCheck_const*,std::vector<MemoryCheck,std::allocator<MemoryCheck>>>
          ::__normal_iterator<MemoryCheck*>
                    ((__normal_iterator<const_MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                      *)CONCAT17(in_stack_fffffffffffffecf,
                                 CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)),
                     (__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                      *)in_stack_fffffffffffffec0._M_current);
          __last._M_current._7_1_ = bVar4;
          __last._M_current._0_7_ = in_stack_ffffffffffffff00;
          in_stack_fffffffffffffed8._M_current._M_current =
               std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::erase
                         ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                           *)in_stack_fffffffffffffee0._M_current._M_current,__first,__last);
          local_a9 = (bool)(*(byte *)(in_RDI + 0xa8) & 1);
          bVar2 = false;
        }
        else {
          local_79 = 0;
          bVar2 = true;
        }
        goto LAB_004e41f4;
      }
      if ((bVar1 != 0) && (*(int *)(in_RDI + 0xac) == 0)) break;
      *(int *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) + 1;
      std::condition_variable::wait(local_f0);
      *(int *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) + -1;
    }
    *(int *)(in_RDI + 0xa4) = *(int *)(in_RDI + 0xa4) + -1;
    local_79 = *(byte *)(in_RDI + 0xa8) & 1;
    *(undefined1 *)(in_RDI + 0xa8) = 1;
    bVar2 = true;
LAB_004e41f4:
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_fffffffffffffeb8);
    if (bVar2) {
      std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::~vector
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT17(in_stack_fffffffffffffecf,
                          CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (bool)(local_79 & 1);
      }
      __stack_chk_fail();
    }
    std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::begin
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_fffffffffffffec0._M_current);
    std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::end
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_fffffffffffffec0._M_current);
    while (bVar2 = __gnu_cxx::
                   operator==<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                             ((__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                               *)CONCAT17(in_stack_fffffffffffffecf,
                                          CONCAT16(in_stack_fffffffffffffece,
                                                   in_stack_fffffffffffffec8)),
                              (__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                               *)in_stack_fffffffffffffec0._M_current), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      __gnu_cxx::
      __normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>::
      operator*((__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                 *)in_stack_fffffffffffffeb8);
      if (local_a9 != false) {
        in_stack_fffffffffffffecf =
             MemoryCheck::operator()((MemoryCheck *)in_stack_fffffffffffffeb8);
        local_a9 = (bool)in_stack_fffffffffffffecf;
      }
      __gnu_cxx::
      __normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>::
      operator++((__normal_iterator<MemoryCheck_*,_std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>_>
                  *)in_stack_fffffffffffffeb8);
    }
    std::vector<MemoryCheck,_std::allocator<MemoryCheck>_>::clear
              ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
               in_stack_fffffffffffffeb8);
  } while( true );
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        std::condition_variable& cond = fMaster ? m_master_cv : m_worker_cv;
        std::vector<T> vChecks;
        vChecks.reserve(nBatchSize);
        unsigned int nNow = 0;
        bool fOk = true;
        do {
            {
                WAIT_LOCK(m_mutex, lock);
                // first do the clean-up of the previous loop run (allowing us to do it in the same critsect)
                if (nNow) {
                    fAllOk &= fOk;
                    nTodo -= nNow;
                    if (nTodo == 0 && !fMaster)
                        // We processed the last element; inform the master it can exit and return the result
                        m_master_cv.notify_one();
                } else {
                    // first iteration
                    nTotal++;
                }
                // logically, the do loop starts here
                while (queue.empty() && !m_request_stop) {
                    if (fMaster && nTodo == 0) {
                        nTotal--;
                        bool fRet = fAllOk;
                        // reset the status for new work later
                        fAllOk = true;
                        // return the current status
                        return fRet;
                    }
                    nIdle++;
                    cond.wait(lock); // wait
                    nIdle--;
                }
                if (m_request_stop) {
                    return false;
                }

                // Decide how many work units to process now.
                // * Do not try to do everything at once, but aim for increasingly smaller batches so
                //   all workers finish approximately simultaneously.
                // * Try to account for idle jobs which will instantly start helping.
                // * Don't do batches smaller than 1 (duh), or larger than nBatchSize.
                nNow = std::max(1U, std::min(nBatchSize, (unsigned int)queue.size() / (nTotal + nIdle + 1)));
                auto start_it = queue.end() - nNow;
                vChecks.assign(std::make_move_iterator(start_it), std::make_move_iterator(queue.end()));
                queue.erase(start_it, queue.end());
                // Check whether we need to do work at all
                fOk = fAllOk;
            }
            // execute work
            for (T& check : vChecks)
                if (fOk)
                    fOk = check();
            vChecks.clear();
        } while (true);
    }